

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O2

int Parser_LoadDocument(IXML_Document **retDoc,char *xmlFileName,int file)

{
  ixml_membuf *m;
  char **ppcVar1;
  char cVar2;
  _IXML_NamespaceURI *p_Var3;
  Nodeptr p_Var4;
  IXML_Document *doc;
  int iVar5;
  IXML_ElementStack *pCur;
  Parser *xmlParser;
  FILE *__stream;
  size_t sVar6;
  char *pcVar7;
  IXML_Attr *pIVar8;
  ptrdiff_t pVar9;
  IXML_NamespaceURI *pIVar10;
  char *pcVar11;
  IXML_NamespaceURI *pIVar12;
  IXML_ElementStack **ppIVar13;
  IXML_ElementStack *pIVar14;
  IXML_NamespaceURI *pIVar15;
  Nodeptr *pp_Var16;
  IXML_NamespaceURI **ppIVar17;
  IXML_ElementStack *pCur_1;
  IXML_Attr *pIVar18;
  long lVar19;
  IXML_Node *pIVar20;
  int iVar21;
  ixml_membuf *m_00;
  bool bVar22;
  ulong uStack_100;
  IXML_Attr *local_f0;
  ixml_membuf *local_e8;
  char **local_e0;
  IXML_ElementStack **local_d8;
  IXML_ElementStack *local_d0;
  IXML_Document *gRootDoc;
  IXML_Document **local_c0;
  uint local_b4;
  IXML_Node *local_b0;
  IXML_Node *tempNode;
  IXML_Node newNode;
  
  xmlParser = (Parser *)calloc(1,0x78);
  if (xmlParser == (Parser *)0x0) {
    return 0x66;
  }
  m = &xmlParser->tokenBuf;
  ixml_membuf_init(m);
  m_00 = &xmlParser->lastElem;
  ixml_membuf_init(m_00);
  if (file != 0) {
    __stream = fopen(xmlFileName,"rb");
    if (__stream == (FILE *)0x0) {
      iVar5 = 0x65;
      goto LAB_001234a2;
    }
    fseek(__stream,0,2);
    sVar6 = ftell(__stream);
    if ((long)sVar6 < 1) {
      iVar5 = 0xc;
    }
    else {
      pcVar7 = (char *)malloc(sVar6 + 1);
      xmlParser->dataBuffer = pcVar7;
      if (pcVar7 != (char *)0x0) {
        fseek(__stream,0,0);
        sVar6 = fread(xmlParser->dataBuffer,1,sVar6,__stream);
        xmlParser->dataBuffer[sVar6] = '\0';
        fclose(__stream);
        pcVar7 = xmlParser->dataBuffer;
        goto LAB_00123333;
      }
      iVar5 = 0x66;
    }
    fclose(__stream);
    goto LAB_001234a2;
  }
  pcVar7 = safe_strdup(xmlFileName);
  xmlParser->dataBuffer = pcVar7;
  if (pcVar7 == (char *)0x0) {
    iVar5 = 0x66;
    goto LAB_001234a2;
  }
LAB_00123333:
  gRootDoc = (IXML_Document *)0x0;
  tempNode = (IXML_Node *)0x0;
  xmlParser->curPtr = pcVar7;
  local_b0 = (IXML_Node *)0x0;
  ixmlNode_init(&newNode);
  iVar5 = ixmlDocument_createDocumentEx(&gRootDoc);
  if (iVar5 == 0) {
    ppcVar1 = &xmlParser->curPtr;
    xmlParser->currentNodePtr = &gRootDoc->n;
    pcVar7 = xmlParser->curPtr;
    if (((*pcVar7 == -0x11) && (pcVar7[1] == -0x45)) && (pcVar7[2] == -0x41)) {
      *ppcVar1 = pcVar7 + 3;
    }
    Parser_skipWhiteSpaces(xmlParser);
    pcVar7 = "<?xml ";
    iVar5 = strncmp(xmlParser->curPtr,"<?xml ",6);
    if (iVar5 == 0) {
      iVar5 = Parser_skipString(ppcVar1,pcVar7);
      Parser_skipWhiteSpaces(xmlParser);
      if (iVar5 != 0) goto LAB_0012348e;
    }
    iVar5 = Parser_skipMisc(xmlParser);
    if (iVar5 == 0) {
      pcVar7 = *ppcVar1;
      local_e0 = ppcVar1;
      iVar5 = strncmp(pcVar7,"<!DOCTYPE",9);
      if (iVar5 == 0) {
        pcVar7 = pcVar7 + 1;
        *local_e0 = pcVar7;
        iVar21 = 1;
        iVar5 = 0xc;
        local_e8 = m_00;
        while (iVar21 != 0) {
          cVar2 = *pcVar7;
          if (cVar2 == '\"') {
            pcVar7 = strchr(pcVar7 + 1,0x22);
            if (pcVar7 == (char *)0x0) goto LAB_0012348e;
          }
          else if (cVar2 == '<') {
            iVar21 = iVar21 + 1;
          }
          else if (cVar2 == '>') {
            iVar21 = iVar21 + -1;
          }
          else if (cVar2 == '\0') goto LAB_0012348e;
          pcVar7 = pcVar7 + 1;
        }
        *local_e0 = pcVar7;
        m_00 = local_e8;
      }
      iVar5 = Parser_skipMisc(xmlParser);
      if (iVar5 == 0) {
        local_d8 = &xmlParser->pCurElement;
        local_b4 = 0xc;
        local_e8 = m_00;
        local_c0 = retDoc;
LAB_001234e3:
        ixmlNode_init(&newNode);
        if (**local_e0 != '\0') {
          if (xmlParser->state == eCONTENT) {
            xmlParser->savePtr = *local_e0;
            Parser_skipWhiteSpaces(xmlParser);
            pIVar18 = (IXML_Attr *)xmlParser->curPtr;
            cVar2 = *(char *)&(pIVar18->n).nodeName;
            if (cVar2 != '\0') {
              local_f0 = pIVar18;
              if (cVar2 != '<') {
                pcVar7 = xmlParser->savePtr;
                xmlParser->curPtr = pcVar7;
                lVar19 = 0;
                do {
                  cVar2 = pcVar7[lVar19];
                  if (cVar2 == ']') {
                    if (pcVar7[lVar19 + 1] != ']') goto LAB_00123748;
                    bVar22 = pcVar7[lVar19 + 2] == '>';
                  }
                  else {
                    if (cVar2 == '<') goto LAB_0012384f;
LAB_00123748:
                    bVar22 = false;
                  }
                  if ((cVar2 == '\0') || (bVar22)) goto LAB_00123836;
                  lVar19 = lVar19 + 1;
                } while( true );
              }
              iVar5 = strncmp((char *)pIVar18,"<![CDATA[",9);
              if (iVar5 != 0) {
                iVar5 = strncmp((char *)pIVar18,"<!--",4);
                if (iVar5 == 0) {
                  iVar5 = Parser_skipComment((char **)&local_f0);
                  if (iVar5 != 0) {
                    iVar5 = 0x5e4;
                    goto LAB_001242f5;
                  }
                  *local_e0 = (char *)local_f0;
                }
                else if (*(char *)((long)&(pIVar18->n).nodeName + 1) == '?') {
                  iVar5 = strncasecmp((char *)pIVar18,"<?xml ",6);
                  if ((iVar5 == 0) || (iVar5 = strncasecmp((char *)pIVar18,"<?xml?",6), iVar5 == 0))
                  {
LAB_001242a5:
                    uStack_100 = 0xc;
                    iVar5 = 0x5ee;
                    goto LAB_001242f9;
                  }
                  iVar5 = strncasecmp((char *)pIVar18,"<?",2);
                  if (iVar5 == 0) {
                    pIVar8 = (IXML_Attr *)strstr((char *)pIVar18,"?>");
                    if ((pIVar8 == (IXML_Attr *)0x0) || (pIVar8 == pIVar18)) goto LAB_001242a5;
                    pIVar18 = (IXML_Attr *)((long)&(pIVar8->n).nodeName + 2);
                  }
                  *local_e0 = (char *)pIVar18;
                }
                else {
                  xmlParser->state = eELEMENT;
                }
                goto LAB_00123e48;
              }
              local_d0 = (IXML_ElementStack *)((long)&(pIVar18->n).nodeValue + 1);
              pcVar7 = (char *)((long)&(pIVar18->n).nodeValue + 4);
              sVar6 = 0;
              while( true ) {
                cVar2 = pcVar7[-3];
                iVar21 = Parser_isXmlChar((int)cVar2);
                iVar5 = 0x5da;
                if ((cVar2 == '\0') || (iVar21 == 0)) goto LAB_001242f5;
                if ((cVar2 == ']') && ((pcVar7[-2] == ']' && (pcVar7[-1] == '>')))) break;
                pcVar7 = pcVar7 + 1;
                sVar6 = sVar6 + 1;
              }
              if ((long)sVar6 < 1) goto LAB_001242f5;
              pcVar11 = (char *)malloc(sVar6 + 1);
              newNode.nodeValue = pcVar11;
              if (pcVar11 != (char *)0x0) {
                strncpy(pcVar11,(char *)local_d0,sVar6);
                pcVar11[sVar6] = '\0';
                newNode.nodeName = strdup("#cdata-section");
                if (newNode.nodeName != (char *)0x0) {
                  newNode.nodeType = eCDATA_SECTION_NODE;
                  *local_e0 = pcVar7;
                  retDoc = local_c0;
                  m_00 = local_e8;
                  goto LAB_00123e48;
                }
              }
              uStack_100 = 0xc;
              iVar5 = 0x5da;
              goto LAB_001242f9;
            }
            goto LAB_00123e48;
          }
          Parser_skipWhiteSpaces(xmlParser);
          pVar9 = Parser_getNextToken(xmlParser);
          if (((pVar9 == 0) && (*local_d8 == (IXML_ElementStack *)0x0)) && (**local_e0 == '\0'))
          goto LAB_00123e48;
          if ((xmlParser->tokenBuf).length == 0) {
            iVar5 = 0x82e;
            goto LAB_001241bc;
          }
          pcVar7 = m->buf;
          cVar2 = *pcVar7;
          if (cVar2 != '/') {
            if (cVar2 == '>') goto LAB_00123e48;
            if (cVar2 != '<') goto LAB_00123771;
            if ((pcVar7[1] != '/') || (pcVar7[2] != '\0')) {
              pVar9 = Parser_getNextToken(xmlParser);
              iVar5 = 0x83e;
              if ((pVar9 == 0) || (m->buf == (char *)0x0)) goto LAB_001241bc;
              newNode.nodeName = strdup(m->buf);
              if (newNode.nodeName == (char *)0x0) goto LAB_00124375;
              iVar21 = ixml_membuf_assign_str(m_00,newNode.nodeName);
              if ((iVar21 != 0) ||
                 (iVar21 = Parser_setNodePrefixAndLocalName(&newNode), iVar21 != 0)) {
                uStack_100 = 0x6a;
                goto LAB_0012431e;
              }
              newNode.nodeValue = (char *)0x0;
              newNode.nodeType = eELEMENT_NODE;
              xmlParser->savePtr = xmlParser->curPtr;
              pVar9 = Parser_getNextToken(xmlParser);
              if (pVar9 == 0) goto LAB_001241bc;
              pcVar7 = m->buf;
              if (*pcVar7 == '>') {
                if (pcVar7[1] == '\0') {
LAB_00124069:
                  xmlParser->state = eCONTENT;
                  goto LAB_00123e48;
                }
LAB_00123aba:
                xmlParser->state = eATTRIBUTE;
              }
              else {
                if (((*pcVar7 != '/') || (pcVar7[1] != '>')) || (pcVar7[2] != '\0'))
                goto LAB_00123aba;
                xmlParser->state = eELEMENT;
              }
              goto LAB_00123e40;
            }
            pVar9 = Parser_getNextToken(xmlParser);
            if (pVar9 == 0) {
              iVar5 = 0x64f;
            }
            else if (m->buf == (char *)0x0) {
              iVar5 = 0x656;
            }
            else {
              newNode.nodeName = strdup(m->buf);
              if (newNode.nodeName == (char *)0x0) {
                iVar5 = 0x65c;
                local_b4 = 0x66;
              }
              else {
                newNode.nodeValue = (char *)0x0;
                newNode.nodeType = eELEMENT_NODE;
                Parser_skipWhiteSpaces(xmlParser);
                pVar9 = Parser_getNextToken(xmlParser);
                if (pVar9 == 0) {
                  iVar5 = 0x668;
                }
                else {
                  pcVar7 = m->buf;
                  if (pcVar7 == (char *)0x0) {
                    iVar5 = 0x670;
                  }
                  else {
                    iVar5 = 0x676;
                    if ((*pcVar7 == '>') && (pcVar7[1] == '\0')) {
                      if (newNode.nodeName == (char *)0x0) {
                        __assert_fail("newNode->nodeName",
                                      "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                                      ,0x9e8,"int Parser_eTagVerification(Parser *, IXML_Node *)");
                      }
                      goto LAB_00123b7d;
                    }
                  }
                }
              }
            }
            uStack_100 = (ulong)local_b4;
            IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                       ,iVar5,"Parser_processETag","Error %d\n",uStack_100);
            iVar5 = 0x83a;
            goto LAB_0012431e;
          }
          if ((pcVar7[1] != '>') || (pcVar7[2] != '\0')) {
LAB_00123771:
            if (*local_d8 == (IXML_ElementStack *)0x0) {
              iVar5 = 0x865;
            }
            else {
              if (xmlParser->state == eATTRIBUTE) {
                iVar5 = Parser_UTF8ToInt(pcVar7,(ptrdiff_t *)&local_f0);
                iVar5 = Parser_isNameChar(iVar5,0);
                if (iVar5 == 0) {
                  iVar5 = 0x786;
                  goto LAB_00124143;
                }
                newNode.nodeName = strdup(pcVar7);
                if (newNode.nodeName == (char *)0x0) {
                  iVar5 = 0x78d;
LAB_001242c4:
                  iVar21 = 0x66;
                  goto LAB_0012414a;
                }
                pVar9 = Parser_getNextToken(xmlParser);
                ppcVar1 = local_e0;
                if (pVar9 == 0) {
                  iVar5 = 0x793;
LAB_00124143:
                  iVar21 = 0xc;
                }
                else {
                  if (*m->buf != '=') {
                    iVar5 = 0x79a;
                    goto LAB_00124143;
                  }
                  pVar9 = Parser_getNextToken(xmlParser);
                  if (pVar9 == 0) {
                    iVar5 = 0x7a0;
                    goto LAB_00124143;
                  }
                  cVar2 = *m->buf;
                  if ((cVar2 != '\'') && (cVar2 != '\"')) {
                    iVar5 = 0x7a7;
                    goto LAB_00124143;
                  }
                  pcVar7 = *ppcVar1;
                  pcVar11 = strstr(pcVar7,m->buf);
                  if (pcVar11 == (char *)0x0) {
                    iVar5 = 0x7ad;
                    goto LAB_00124143;
                  }
                  while (pcVar7 < pcVar11) {
                    cVar2 = *pcVar7;
                    pcVar7 = pcVar7 + 1;
                    if (cVar2 == '<') {
                      iVar5 = 0x7b6;
                      goto LAB_00124143;
                    }
                  }
                  ixml_membuf_destroy(m);
                  lVar19 = (long)pcVar11 - (long)*local_e0;
                  if ((lVar19 != 0) &&
                     (iVar5 = Parser_copyToken(xmlParser,*local_e0,lVar19), iVar5 != 0)) {
                    iVar5 = 0x7c6;
                    goto LAB_00124143;
                  }
                  m_00 = local_e8;
                  *local_e0 = pcVar11 + 1;
                  if (m->buf == (char *)0x0) {
                    newNode.nodeValue = (char *)malloc(1);
                    *newNode.nodeValue = '\0';
                  }
                  else {
                    newNode.nodeValue = strdup(m->buf);
                    if (newNode.nodeValue == (char *)0x0) {
                      iVar5 = 0x7d2;
                      goto LAB_001242c4;
                    }
                  }
                  pcVar7 = newNode.nodeName;
                  newNode.nodeType = eATTRIBUTE_NODE;
                  if (newNode.nodeName == (char *)0x0) {
                    __assert_fail("newNode->nodeName != NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                                  ,0x6f0,"int Parser_xmlNamespace(Parser *, IXML_Node *)");
                  }
                  local_d0 = *local_d8;
                  iVar5 = strcmp(newNode.nodeName,"xmlns");
                  pIVar14 = local_d0;
                  if (iVar5 == 0) {
                    free(local_d0->namespaceUri);
                    pcVar7 = safe_strdup(newNode.nodeValue);
                    pIVar14->namespaceUri = pcVar7;
                    if (pcVar7 == (char *)0x0) {
                      iVar5 = 0x6fa;
                      goto LAB_00124435;
                    }
LAB_00123d4d:
                    pIVar20 = xmlParser->pNeedPrefixNode;
                    if (pIVar20 != (IXML_Node *)0x0) {
                      pIVar14 = *local_d8;
                      pcVar7 = pIVar20->prefix;
                      if (pcVar7 == (char *)0x0) {
                        iVar5 = strcmp(pIVar20->nodeName,pIVar14->element);
                        if (iVar5 != 0) {
LAB_001242b0:
                          iVar21 = 0x6a;
LAB_001242e6:
                          iVar5 = 0x755;
                          goto LAB_0012444e;
                        }
                        pcVar7 = pIVar14->namespaceUri;
                        m_00 = local_e8;
                        if (pcVar7 != (char *)0x0) {
                          if (pIVar20->namespaceURI != (char *)0x0) {
                            __assert_fail("pNode->namespaceURI == NULL",
                                          "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                                          ,0x6c8,"int Parser_addNamespace(Parser *)");
                          }
LAB_00123de5:
                          m_00 = local_e8;
                          pcVar7 = strdup(pcVar7);
                          pIVar20->namespaceURI = pcVar7;
                          if (pcVar7 == (char *)0x0) {
                            iVar21 = 0x66;
                            goto LAB_001242e6;
                          }
                        }
                        xmlParser->pNeedPrefixNode = (IXML_Node *)0x0;
                      }
                      else {
                        pcVar11 = pIVar14->prefix;
                        if ((pcVar11 == (char *)0x0) ||
                           ((local_d0 = pIVar14, iVar5 = strcmp(pIVar20->nodeName,pIVar14->element),
                            iVar5 != 0 && (iVar5 = strcmp(pcVar7,pcVar11), iVar5 != 0))))
                        goto LAB_001242b0;
                        pcVar7 = local_d0->namespaceUri;
                        m_00 = local_e8;
                        if (pcVar7 != (char *)0x0) goto LAB_00123de5;
                      }
                    }
                    xmlParser->savePtr = xmlParser->curPtr;
                    pVar9 = Parser_getNextToken(xmlParser);
                    if (pVar9 != 0) {
                      pcVar7 = m->buf;
                      retDoc = local_c0;
                      if (*pcVar7 == '>') {
                        if (pcVar7[1] == '\0') goto LAB_00124069;
                      }
                      else if ((*pcVar7 == '<') && (pcVar7[1] == '\0')) {
                        iVar5 = 0x7ee;
                        iVar21 = 0x6a;
                        goto LAB_0012414a;
                      }
LAB_00123e40:
                      xmlParser->curPtr = xmlParser->savePtr;
                      goto LAB_00123e48;
                    }
                    iVar5 = 0x7e7;
                    goto LAB_00124143;
                  }
                  iVar5 = strncmp(pcVar7,"xmlns:",6);
                  if (iVar5 != 0) goto LAB_00123d4d;
                  iVar21 = Parser_setNodePrefixAndLocalName(&newNode);
                  pcVar7 = newNode.localName;
                  pIVar14 = local_d0;
                  if (iVar21 == 0) {
                    if (newNode.localName == (char *)0x0) {
                      __assert_fail("newNode->localName != NULL",
                                    "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                                    ,0x706,"int Parser_xmlNamespace(Parser *, IXML_Node *)");
                    }
                    if (local_d0 == (IXML_ElementStack *)0x0) {
                      iVar5 = 0x70a;
                      iVar21 = 0x6a;
                    }
                    else {
                      if ((local_d0->prefix == (char *)0x0) ||
                         (iVar5 = strcmp(local_d0->prefix,newNode.localName), iVar5 != 0)) {
                        local_d0 = (IXML_ElementStack *)&pIVar14->pNsURI;
                        pIVar12 = pIVar14->pNsURI;
                        pIVar15 = pIVar14->pNsURI;
                        while (pIVar10 = pIVar12, pIVar10 != (IXML_NamespaceURI *)0x0) {
                          if ((pIVar10->prefix != (char *)0x0) &&
                             (iVar5 = strcmp(pIVar10->prefix,pcVar7), iVar5 == 0)) {
                            free(pIVar10->nsURI);
                            pcVar7 = safe_strdup(newNode.nodeValue);
                            pIVar10->nsURI = pcVar7;
                            m_00 = local_e8;
                            if (pcVar7 != (char *)0x0) goto LAB_00123d4d;
                            iVar5 = 0x74d;
                            goto LAB_00124435;
                          }
                          pIVar15 = pIVar10;
                          pIVar12 = pIVar10->nextNsURI;
                        }
                        pIVar12 = (IXML_NamespaceURI *)calloc(1,0x18);
                        if (pIVar12 != (IXML_NamespaceURI *)0x0) {
                          pcVar7 = strdup(pcVar7);
                          m_00 = local_e8;
                          pIVar12->prefix = pcVar7;
                          if (pcVar7 == (char *)0x0) {
                            iVar5 = 0x735;
                          }
                          else {
                            pcVar7 = safe_strdup(newNode.nodeValue);
                            pIVar12->nsURI = pcVar7;
                            if (pcVar7 != (char *)0x0) {
                              pIVar14 = (IXML_ElementStack *)&pIVar15->nextNsURI;
                              if (local_d0->element == (char *)0x0) {
                                pIVar14 = local_d0;
                              }
                              pIVar14->element = (char *)pIVar12;
                              goto LAB_00123d4d;
                            }
                            Parser_freeNsURI(pIVar12);
                            iVar5 = 0x73d;
                          }
                          free(pIVar12);
                          iVar21 = 0x66;
                          goto LAB_0012444e;
                        }
                        iVar5 = 0x72c;
                      }
                      else {
                        free(pIVar14->namespaceUri);
                        pcVar7 = safe_strdup(newNode.nodeValue);
                        pIVar14->namespaceUri = pcVar7;
                        if (pcVar7 != (char *)0x0) goto LAB_00123d4d;
                        iVar5 = 0x715;
                      }
LAB_00124435:
                      iVar21 = 0x66;
                    }
                  }
                  else {
                    iVar5 = 0x702;
                  }
LAB_0012444e:
                  IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                             ,iVar5,"Parser_xmlNamespace","Error %d\n",iVar21);
                  iVar5 = 0x7e0;
                }
LAB_0012414a:
                uStack_100 = 0xc;
                IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                           ,iVar5,"Parser_processAttribute","Error %d\n",iVar21);
                iVar5 = 0x85a;
                goto LAB_0012431e;
              }
              iVar5 = 0x860;
            }
LAB_001241bc:
            uStack_100 = 0xc;
            goto LAB_0012431e;
          }
          if (m_00->buf == (char *)0x0) {
            iVar5 = 0x844;
            goto LAB_001241bc;
          }
          newNode.nodeName = strdup(m_00->buf);
          if (newNode.nodeName == (char *)0x0) {
            iVar5 = 0x84b;
LAB_00124375:
            uStack_100 = 0x66;
            goto LAB_0012431e;
          }
          newNode.nodeType = eELEMENT_NODE;
LAB_00123b7d:
          pIVar20 = xmlParser->currentNodePtr;
          if (pIVar20 == (IXML_Node *)0x0) {
            __assert_fail("xmlParser->currentNodePtr",
                          "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                          ,0x9e9,"int Parser_eTagVerification(Parser *, IXML_Node *)");
          }
          if (newNode.nodeType != eELEMENT_NODE) {
LAB_00123c0f:
            iVar5 = strcmp(newNode.nodeName,pIVar20->nodeName);
            if (iVar5 != 0) goto LAB_00124174;
            xmlParser->currentNodePtr = pIVar20->parentNode;
            xmlParser->state = eCONTENT;
            goto switchD_00123e65_default;
          }
          pIVar14 = *local_d8;
          if (pIVar14 != (IXML_ElementStack *)0x0) {
            if (pIVar14->element == (char *)0x0) {
              __assert_fail("xmlParser->pCurElement->element",
                            "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                            ,0x9bf,"int Parser_isValidEndElement(Parser *, IXML_Node *)");
            }
            iVar5 = strcmp(pIVar14->element,newNode.nodeName);
            if (iVar5 == 0) {
              *local_d8 = pIVar14->nextElement;
              Parser_freeElementStackItem(pIVar14);
              pIVar12 = pIVar14->pNsURI;
              while (pIVar12 != (IXML_NamespaceURI *)0x0) {
                p_Var3 = pIVar12->nextNsURI;
                Parser_freeNsURI(pIVar12);
                free(pIVar12);
                pIVar12 = p_Var3;
              }
              free(pIVar14);
              pIVar20 = xmlParser->currentNodePtr;
              retDoc = local_c0;
              m_00 = local_e8;
              goto LAB_00123c0f;
            }
          }
          goto LAB_00124174;
        }
        iVar5 = 0xc;
        if (*local_d8 == (IXML_ElementStack *)0x0) {
          *retDoc = gRootDoc;
          Parser_free(xmlParser);
          return 0;
        }
      }
    }
  }
LAB_0012348e:
  Parser_freeNodeContent(&newNode);
  ixmlDocument_free(gRootDoc);
LAB_001234a2:
  Parser_free(xmlParser);
  return iVar5;
LAB_00123836:
  if ((cVar2 == ']') && ((pcVar7[lVar19 + 1] == ']' && (pcVar7[lVar19 + 2] == '>')))) {
    iVar5 = 0x608;
LAB_001242f5:
    uStack_100 = 0xc;
LAB_001242f9:
    IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
               ,iVar5,"Parser_processContent","Error %d\n",uStack_100);
    iVar5 = 0x821;
LAB_0012431e:
    IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
               ,iVar5,"Parser_getNextNode","Error %d\n",uStack_100);
    iVar5 = 0x6a;
    goto LAB_0012348e;
  }
LAB_0012384f:
  ixml_membuf_destroy(m);
  iVar5 = Parser_copyToken(xmlParser,xmlParser->curPtr,lVar19);
  if (iVar5 != 0) {
    iVar5 = 0x613;
    goto LAB_001242f5;
  }
  if (m->buf == (char *)0x0) {
    iVar5 = 0x621;
    goto LAB_001242f5;
  }
  newNode.nodeValue = strdup(m->buf);
  if (newNode.nodeValue == (char *)0x0) {
    iVar5 = 0x61c;
    uStack_100 = 0x66;
    goto LAB_001242f9;
  }
  newNode.nodeName = strdup("#text");
  if (newNode.nodeName == (char *)0x0) {
    iVar5 = 0x628;
    goto LAB_001242f5;
  }
  newNode.nodeType = eTEXT_NODE;
  *local_e0 = *local_e0 + lVar19;
LAB_00123e48:
  pcVar7 = newNode.nodeName;
  doc = gRootDoc;
  switch(newNode.nodeType) {
  case eELEMENT_NODE:
    local_f0 = (IXML_Attr *)0x0;
    if (xmlParser->bHasTopLevel == 0) {
      xmlParser->bHasTopLevel = 1;
    }
    else if (*local_d8 == (IXML_ElementStack *)0x0) {
LAB_00124174:
      iVar5 = 0xc;
      goto LAB_0012348e;
    }
    xmlParser->savePtr = xmlParser->curPtr;
    iVar5 = ixmlDocument_createElementEx(gRootDoc,newNode.nodeName,(IXML_Element **)&local_f0);
    if (iVar5 != 0) goto LAB_0012348e;
    iVar5 = ixmlNode_setNodeProperties(&local_f0->n,&newNode);
    pcVar7 = newNode.prefix;
    if (iVar5 != 0) goto LAB_00124284;
    ppIVar13 = local_d8;
    if (newNode.prefix == (char *)0x0) {
      while (pIVar14 = *ppIVar13, pIVar14 != (IXML_ElementStack *)0x0) {
        if ((pIVar14->prefix == (char *)0x0) && (pIVar14->namespaceUri != (char *)0x0)) {
          Parser_setElementNamespace((IXML_Element *)local_f0,pIVar14->namespaceUri);
          goto LAB_0012408f;
        }
        ppIVar13 = &pIVar14->nextElement;
      }
      if (xmlParser->state == eATTRIBUTE) goto LAB_0012405e;
    }
    else {
      while (pIVar14 = *ppIVar13, pIVar14 != (IXML_ElementStack *)0x0) {
        if ((pIVar14->prefix != (char *)0x0) && (iVar5 = strcmp(pIVar14->prefix,pcVar7), iVar5 == 0)
           ) {
          pIVar12 = (IXML_NamespaceURI *)&pIVar14->namespaceUri;
LAB_0012407c:
          Parser_setElementNamespace((IXML_Element *)local_f0,pIVar12->nsURI);
          retDoc = local_c0;
          goto LAB_0012408f;
        }
        ppIVar17 = &pIVar14->pNsURI;
        while (pIVar12 = *ppIVar17, pIVar12 != (IXML_NamespaceURI *)0x0) {
          iVar5 = strcmp(pIVar12->prefix,pcVar7);
          if (iVar5 == 0) goto LAB_0012407c;
          ppIVar17 = &pIVar12->nextNsURI;
        }
        retDoc = local_c0;
        ppIVar13 = &pIVar14->nextElement;
      }
LAB_0012405e:
      xmlParser->pNeedPrefixNode = &local_f0->n;
    }
LAB_0012408f:
    iVar5 = ixmlNode_appendChild(xmlParser->currentNodePtr,&local_f0->n);
    pIVar18 = local_f0;
    if (iVar5 != 0) {
LAB_00124284:
      ixmlElement_free((IXML_Element *)local_f0);
      goto LAB_0012348e;
    }
    xmlParser->currentNodePtr = &local_f0->n;
    if (local_f0 == (IXML_Attr *)0x0) {
      __assert_fail("newElement",
                    "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                    ,0x90a,"int Parser_pushElement(Parser *, IXML_Node *)");
    }
    pIVar14 = (IXML_ElementStack *)calloc(1,0x28);
    if (pIVar14 == (IXML_ElementStack *)0x0) goto LAB_0012422d;
    pcVar7 = safe_strdup((pIVar18->n).nodeName);
    pIVar14->element = pcVar7;
    if (pcVar7 != (char *)0x0) {
      pcVar7 = (pIVar18->n).prefix;
      if (pcVar7 == (char *)0x0) {
LAB_001240fd:
        pcVar7 = (pIVar18->n).namespaceURI;
        if (pcVar7 != (char *)0x0) {
          pcVar7 = strdup(pcVar7);
          pIVar14->namespaceUri = pcVar7;
          if (pcVar7 == (char *)0x0) goto LAB_0012421d;
        }
        pIVar14->nextElement = *local_d8;
        *local_d8 = pIVar14;
        m_00 = local_e8;
        goto switchD_00123e65_default;
      }
      pcVar7 = strdup(pcVar7);
      pIVar14->prefix = pcVar7;
      if (pcVar7 != (char *)0x0) goto LAB_001240fd;
LAB_0012421d:
      Parser_freeElementStackItem(pIVar14);
    }
    free(pIVar14);
LAB_0012422d:
    iVar5 = 0x66;
    goto LAB_0012348e;
  case eATTRIBUTE_NODE:
    local_f0 = (IXML_Attr *)0x0;
    pp_Var16 = &xmlParser->currentNodePtr->firstAttr;
    while (p_Var4 = *pp_Var16, p_Var4 != (Nodeptr)0x0) {
      iVar5 = strcmp(p_Var4->nodeName,pcVar7);
      pp_Var16 = &p_Var4->nextSibling;
      if (iVar5 == 0) goto LAB_00124174;
    }
    iVar5 = ixmlDocument_createAttributeEx(doc,pcVar7,&local_f0);
    if (iVar5 != 0) goto LAB_0012348e;
    iVar5 = ixmlNode_setNodeProperties(&local_f0->n,&newNode);
    retDoc = local_c0;
    m_00 = local_e8;
    if ((iVar5 != 0) ||
       (iVar5 = ixmlElement_setAttributeNode
                          ((IXML_Element *)xmlParser->currentNodePtr,local_f0,(IXML_Attr **)0x0),
       iVar5 != 0)) {
      ixmlAttr_free(local_f0);
      goto LAB_0012348e;
    }
    goto switchD_00123e65_default;
  case eTEXT_NODE:
    iVar5 = ixmlDocument_createTextNodeEx(gRootDoc,newNode.nodeValue,&tempNode);
    if (iVar5 != 0) goto LAB_0012348e;
    iVar5 = ixmlNode_appendChild(xmlParser->currentNodePtr,tempNode);
    pIVar20 = tempNode;
    break;
  case eCDATA_SECTION_NODE:
    iVar5 = ixmlDocument_createCDATASectionEx
                      (gRootDoc,newNode.nodeValue,(IXML_CDATASection **)&local_b0);
    if (iVar5 != 0) goto LAB_0012348e;
    iVar5 = ixmlNode_appendChild(xmlParser->currentNodePtr,local_b0);
    pIVar20 = local_b0;
    break;
  default:
    goto switchD_00123e65_default;
  }
  if (iVar5 != 0) {
    ixmlNode_free(pIVar20);
    goto LAB_0012348e;
  }
switchD_00123e65_default:
  Parser_freeNodeContent(&newNode);
  goto LAB_001234e3;
}

Assistant:

int Parser_LoadDocument(
	/*! [out] The output document tree. */
	IXML_Document **retDoc,
	/*! [in] The file name or the buffer to copy, according to the
	 * parameter "file". */
	const char *xmlFileName,
	/*! [in] 1 if you want to read from a file, 0 if xmlFileName is
	 * the buffer to copy to the parser. */
	int file)
{
	int rc = IXML_SUCCESS;
	Parser *xmlParser = NULL;

	xmlParser = Parser_init();
	if (xmlParser == NULL) {
		return IXML_INSUFFICIENT_MEMORY;
	}

	rc = Parser_readFileOrBuffer(xmlParser, xmlFileName, file);
	if (rc != IXML_SUCCESS) {
		Parser_free(xmlParser);
		return rc;
	}

	xmlParser->curPtr = xmlParser->dataBuffer;
	rc = Parser_parseDocument(retDoc, xmlParser);
	return rc;
}